

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

string * __thiscall
helics::Federate::queryComplete_abi_cxx11_
          (string *__return_storage_ptr__,Federate *this,QueryId *queryIndex)

{
  iterator iVar1;
  handle asyncInfo;
  allocator<char> local_51;
  string local_50;
  handle local_30;
  
  if (this->singleThreadFederate == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "Async queries are not allowed when using single thread federates",
               (allocator<char> *)&local_30);
    generateJsonErrorResponse(__return_storage_ptr__,METHOD_NOT_ALLOWED,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (&local_30,
               (this->asyncCallInfo)._M_t.
               super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
               .
               super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
               ._M_head_impl);
    local_50._M_dataplus._M_p._0_4_ = queryIndex->ivalue;
    iVar1 = std::
            _Rb_tree<int,_std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::find(&((local_30.data)->inFlightQueries)._M_t,(key_type *)&local_50);
    if ((_Rb_tree_header *)iVar1._M_node ==
        &((local_30.data)->inFlightQueries)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"No Async queries are available",&local_51);
      generateJsonErrorResponse(__return_storage_ptr__,METHOD_NOT_ALLOWED,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get(__return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&iVar1._M_node[1]._M_parent);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_30.m_handle_lock);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Federate::queryComplete(QueryId queryIndex)  // NOLINT
{
    if (singleThreadFederate) {
        return generateJsonErrorResponse(
            JsonErrorCodes::METHOD_NOT_ALLOWED,
            "Async queries are not allowed when using single thread federates");
    }
    auto asyncInfo = asyncCallInfo->lock();
    auto fnd = asyncInfo->inFlightQueries.find(queryIndex.value());
    if (fnd != asyncInfo->inFlightQueries.end()) {
        return fnd->second.get();
    }
    return generateJsonErrorResponse(JsonErrorCodes::METHOD_NOT_ALLOWED,
                                     "No Async queries are available");
}